

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

time_point spdlog::details::os::now(void)

{
  duration dVar1;
  
  dVar1.__r = std::chrono::_V2::system_clock::now();
  return (time_point)(duration)dVar1.__r;
}

Assistant:

inline spdlog::log_clock::time_point now()
{

#if defined __linux__ && defined SPDLOG_CLOCK_COARSE
    timespec ts;
    ::clock_gettime(CLOCK_REALTIME_COARSE, &ts);
    return std::chrono::time_point<log_clock, typename log_clock::duration>(
        std::chrono::duration_cast<typename log_clock::duration>(std::chrono::seconds(ts.tv_sec) + std::chrono::nanoseconds(ts.tv_nsec)));

#else
    return log_clock::now();
#endif
}